

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

Result<unsigned_int> * __thiscall
wasm::WATParser::ParseDefsCtx::getFieldFromIdx
          (Result<unsigned_int> *__return_storage_ptr__,ParseDefsCtx *this,HeapType type,
          uint32_t idx)

{
  bool bVar1;
  ulong uVar2;
  Struct *this_00;
  size_type sVar3;
  allocator<char> local_c1;
  string local_c0;
  Err local_a0;
  allocator<char> local_69;
  string local_68;
  Err local_48;
  uint local_24;
  ParseDefsCtx *pPStack_20;
  uint32_t idx_local;
  ParseDefsCtx *this_local;
  HeapType type_local;
  
  local_24 = idx;
  pPStack_20 = this;
  this_local = (ParseDefsCtx *)type.id;
  type_local.id = (uintptr_t)__return_storage_ptr__;
  bVar1 = HeapType::isStruct((HeapType *)&this_local);
  if (bVar1) {
    uVar2 = (ulong)local_24;
    this_00 = HeapType::getStruct((HeapType *)&this_local);
    sVar3 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size(&this_00->fields);
    if (uVar2 < sVar3) {
      Result<unsigned_int>::Result<unsigned_int>(__return_storage_ptr__,&local_24);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"struct index out of bounds",&local_c1);
      Lexer::err(&local_a0,&this->in,&local_c0);
      Result<unsigned_int>::Result(__return_storage_ptr__,&local_a0);
      wasm::Err::~Err(&local_a0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator(&local_c1);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"expected struct type",&local_69);
    Lexer::err(&local_48,&this->in,&local_68);
    Result<unsigned_int>::Result(__return_storage_ptr__,&local_48);
    wasm::Err::~Err(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<Index> getFieldFromIdx(HeapType type, uint32_t idx) {
    if (!type.isStruct()) {
      return in.err("expected struct type");
    }
    if (idx >= type.getStruct().fields.size()) {
      return in.err("struct index out of bounds");
    }
    return idx;
  }